

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

QIcon __thiscall QComboBoxPrivate::itemIcon(QComboBoxPrivate *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  int *in_RDX;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  long in_FS_OFFSET;
  QMetaType local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  uint uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*in_RDX < 0) || (in_RDX[1] < 0)) || (*(long *)(in_RDX + 4) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_003d7bf5;
    QIcon::QIcon((QIcon *)this);
  }
  else {
    paVar5 = &local_38;
    local_38._16_4_ = 0xaaaaaaaa;
    local_38._20_4_ = 0xaaaaaaaa;
    uStack_20 = 0xaaaaaaaa;
    uStack_1c = 0xaaaaaaaa;
    local_38._0_4_ = 0xaaaaaaaa;
    local_38._4_4_ = 0xaaaaaaaa;
    local_38._8_4_ = 0xaaaaaaaa;
    local_38._12_4_ = 0xaaaaaaaa;
    pQVar1 = index[0x1b].m.ptr;
    (**(code **)(*(long *)pQVar1 + 0x90))(paVar5,pQVar1,in_RDX,1);
    iVar3 = ::QVariant::typeId((QVariant *)paVar5);
    if (iVar3 == 0x1001) {
      local_40.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QPixmap>::metaType;
      local_58.d_ptr = (QMetaTypeInterface *)(CONCAT44(uStack_1c,uStack_20) & 0xfffffffffffffffc);
      bVar2 = comparesEqual(&local_58,&local_40);
      if (bVar2) {
        if ((uStack_20 & 1) == 0) {
          paVar5 = &local_38;
        }
        else {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 4) +
                   CONCAT44(local_38._4_4_,local_38._0_4_));
        }
        QPixmap::QPixmap((QPixmap *)&local_58,(QPixmap *)paVar5->data);
      }
      else {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPixmap::QPixmap((QPixmap *)&local_58);
        paVar5 = &local_38;
        QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_20 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 4) +
                   CONCAT44(local_38._4_4_,local_38._0_4_));
        }
        QMetaType::convert(QVar4,paVar5,local_40,&local_58);
      }
      QIcon::QIcon((QIcon *)this,(QPixmap *)&local_58);
      QPixmap::~QPixmap((QPixmap *)&local_58);
    }
    else {
      local_58.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
      local_40.d_ptr = (QMetaTypeInterface *)(CONCAT44(uStack_1c,uStack_20) & 0xfffffffffffffffc);
      bVar2 = comparesEqual(&local_40,&local_58);
      if (bVar2) {
        if ((uStack_20 & 1) == 0) {
          paVar5 = &local_38;
        }
        else {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 4) +
                   CONCAT44(local_38._4_4_,local_38._0_4_));
        }
        QIcon::QIcon((QIcon *)this,(QIcon *)&paVar5->shared);
      }
      else {
        *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
        QIcon::QIcon((QIcon *)this);
        QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((uStack_20 & 1) != 0) {
          paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                   ((long)*(int *)(CONCAT44(local_38._4_4_,local_38._0_4_) + 4) +
                   CONCAT44(local_38._4_4_,local_38._0_4_));
        }
        QMetaType::convert(QVar4,paVar5,local_58,this);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_003d7bf5:
      __stack_chk_fail();
    }
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QComboBoxPrivate::itemIcon(const QModelIndex &index) const
{
    if (!index.isValid())
        return {};
    QVariant decoration = model->data(index, Qt::DecorationRole);
    if (decoration.userType() == QMetaType::QPixmap)
        return QIcon(qvariant_cast<QPixmap>(decoration));
    else
        return qvariant_cast<QIcon>(decoration);
}